

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

pair<std::pair<sjtu::orderType,_long>_*,_long> __thiscall
sjtu::FileManager<std::pair<sjtu::orderType,_long>_>::newspace
          (FileManager<std::pair<sjtu::orderType,_long>_> *this)

{
  undefined1 *puVar1;
  pair<std::pair<sjtu::orderType,_long>_*,_long> pVar2;
  locType offset;
  pair<sjtu::orderType,_long> tmp;
  long local_e8;
  undefined1 local_e0 [192];
  
  puVar1 = &(this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).field_0x18;
  std::ostream::seekp((long)puVar1,_S_beg);
  std::ios::clear((int)this + 8 +
                  (int)*(undefined8 *)
                        (*(long *)&(this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>)
                                   .file + -0x18));
  memset(local_e0,0,0xc0);
  local_e8 = std::ostream::tellp();
  std::ostream::write(puVar1,(long)local_e0);
  pVar2.first = LRUCache<std::pair<sjtu::orderType,_long>_>::load
                          ((this->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).cache,
                           &local_e8);
  pVar2.second = local_e8;
  return pVar2;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}